

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O1

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  bool bVar1;
  SI_Error SVar2;
  int iVar3;
  char *__s;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  bool bVar10;
  pointer eventParameter;
  bool bVar11;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  diskFiles;
  string local_258;
  string to_date;
  string extra_data;
  string client_signature;
  string from_date;
  string local_1b8;
  FullLicenseInfo licInfo;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_98;
  
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diskFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getLicenseDiskFiles(__return_storage_ptr__,this,&diskFiles);
  bVar1 = EventRegistry::isGood(__return_storage_ptr__);
  if (bVar1) {
    local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar1 = false;
    local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98.m_pData = (char *)0x0;
    local_98.m_uDataLen = 0;
    local_98.m_pFileComment = (char *)0x0;
    local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98.m_strings;
    local_98.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node._M_size._0_7_ = 0;
    local_98._95_4_ = 0;
    local_98.m_bSpaces = true;
    local_98.m_nOrder = 0;
    local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_98.m_strings.
    super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_98.m_strings.
         super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (diskFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        diskFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar10 = false;
      bVar11 = false;
    }
    else {
      bVar11 = false;
      bVar10 = false;
      bVar1 = false;
      eventParameter =
           diskFiles.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      do {
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset(&local_98);
        SVar2 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                          (&local_98,(eventParameter->_M_dataplus)._M_p);
        if (SVar2 < SI_OK) {
          EventRegistry::addEvent
                    (__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED,SVRT_WARN,eventParameter);
        }
        else {
          pcVar8 = (product->_M_dataplus)._M_p;
          iVar3 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                            (&local_98,pcVar8);
          if (iVar3 < 1) {
            bVar11 = true;
            EventRegistry::addEvent
                      (__return_storage_ptr__,PRODUCT_NOT_LICENSED,SVRT_WARN,eventParameter);
          }
          else {
            __s = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                            (&local_98,pcVar8,"license_signature",(char *)0x0,(bool *)0x0);
            lVar4 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetLongValue
                              (&local_98,pcVar8,"license_version",-1,(bool *)0x0);
            if (lVar4 < 1 || __s == (char *)0x0) {
              bVar10 = true;
              EventRegistry::addEvent
                        (__return_storage_ptr__,LICENSE_MALFORMED,SVRT_WARN,eventParameter);
              bVar11 = true;
            }
            else {
              pcVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_98,pcVar8,"from_date",FullLicenseInfo::UNUSED_TIME,
                                  (bool *)0x0);
              std::__cxx11::string::string((string *)&licInfo,pcVar5,(allocator *)&to_date);
              trim_copy(&from_date,&licInfo.source);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.source._M_dataplus._M_p != &licInfo.source.field_2) {
                operator_delete(licInfo.source._M_dataplus._M_p);
              }
              pcVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_98,pcVar8,"to_date",FullLicenseInfo::UNUSED_TIME,
                                  (bool *)0x0);
              std::__cxx11::string::string((string *)&licInfo,pcVar5,(allocator *)&client_signature)
              ;
              trim_copy(&to_date,&licInfo.source);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.source._M_dataplus._M_p != &licInfo.source.field_2) {
                operator_delete(licInfo.source._M_dataplus._M_p);
              }
              pcVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_98,pcVar8,"client_signature","",(bool *)0x0);
              std::__cxx11::string::string((string *)&licInfo,pcVar5,(allocator *)&extra_data);
              trim_copy(&client_signature,&licInfo.source);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.source._M_dataplus._M_p != &licInfo.source.field_2) {
                operator_delete(licInfo.source._M_dataplus._M_p);
              }
              lVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                      GetLongValue(&local_98,pcVar8,"from_sw_version",0,(bool *)0x0);
              lVar7 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                      GetLongValue(&local_98,pcVar8,"to_sw_version",0,(bool *)0x0);
              pcVar8 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_98,pcVar8,"extra_data","",(bool *)0x0);
              std::__cxx11::string::string((string *)&licInfo,pcVar8,(allocator *)&local_2a8);
              trim_copy(&extra_data,&licInfo.source);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.source._M_dataplus._M_p != &licInfo.source.field_2) {
                operator_delete(licInfo.source._M_dataplus._M_p);
              }
              local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
              sVar9 = strlen(__s);
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,__s,__s + sVar9);
              local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_258,from_date._M_dataplus._M_p,
                         from_date._M_dataplus._M_p + from_date._M_string_length);
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,to_date._M_dataplus._M_p,
                         to_date._M_dataplus._M_p + to_date._M_string_length);
              FullLicenseInfo::FullLicenseInfo
                        (&licInfo,eventParameter,product,&local_2a8,(int)lVar4,&local_258,&local_1b8
                         ,&client_signature,(uint)lVar6,(uint)lVar7,&extra_data);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p);
              }
              std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
              push_back(licenseInfoOut,&licInfo);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.extra_data._M_dataplus._M_p != &licInfo.extra_data.field_2) {
                operator_delete(licInfo.extra_data._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.client_signature._M_dataplus._M_p != &licInfo.client_signature.field_2)
              {
                operator_delete(licInfo.client_signature._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.to_date._M_dataplus._M_p != &licInfo.to_date.field_2) {
                operator_delete(licInfo.to_date._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.from_date._M_dataplus._M_p != &licInfo.from_date.field_2) {
                operator_delete(licInfo.from_date._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.license_signature._M_dataplus._M_p !=
                  &licInfo.license_signature.field_2) {
                operator_delete(licInfo.license_signature._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.product._M_dataplus._M_p != &licInfo.product.field_2) {
                operator_delete(licInfo.product._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)licInfo.source._M_dataplus._M_p != &licInfo.source.field_2) {
                operator_delete(licInfo.source._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)extra_data._M_dataplus._M_p != &extra_data.field_2) {
                operator_delete(extra_data._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)client_signature._M_dataplus._M_p != &client_signature.field_2) {
                operator_delete(client_signature._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)to_date._M_dataplus._M_p != &to_date.field_2) {
                operator_delete(to_date._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)from_date._M_dataplus._M_p != &from_date.field_2) {
                operator_delete(from_date._M_dataplus._M_p);
              }
              bVar1 = true;
              bVar10 = true;
              bVar11 = true;
            }
          }
        }
        eventParameter = eventParameter + 1;
      } while (eventParameter !=
               diskFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (!bVar11) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,FILE_FORMAT_NOT_RECOGNIZED);
    }
    if (!bVar10) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,PRODUCT_NOT_LICENSED);
    }
    if (!bVar1) {
      EventRegistry::turnEventIntoError(__return_storage_ptr__,LICENSE_MALFORMED);
    }
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl(&local_98);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&diskFiles);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product,
		vector<FullLicenseInfo>& licenseInfoOut) {
	vector<string> diskFiles;
	EventRegistry result = getLicenseDiskFiles(diskFiles);
	if (!result.isGood()) {
		return result;
	}
	bool loadAtLeastOneFile = false;
	bool atLeastOneProductLicensed = false;
	bool atLeastOneLicenseComplete = false;
	CSimpleIniA ini;
	for (auto it = diskFiles.begin(); it != diskFiles.end(); it++) {
		ini.Reset();
		SI_Error rc = ini.LoadFile((*it).c_str());
		if (rc < 0) {
			result.addEvent(FILE_FORMAT_NOT_RECOGNIZED, SVRT_WARN, *it);
			continue;
		} else {
			loadAtLeastOneFile = true;
		}
		const char* productNamePtr = product.c_str();
		int sectionSize = ini.GetSectionSize(productNamePtr);
		if (sectionSize <= 0) {
			result.addEvent(PRODUCT_NOT_LICENSED, SVRT_WARN, *it);
			continue;
		} else {
			atLeastOneProductLicensed = true;
		}
		/*
		 *  sw_version_from = (optional int)
		 *  sw_version_to = (optional int)
		 *  from_date = YYYY-MM-DD (optional)
		 *  to_date  = YYYY-MM-DD (optional)
		 *  client_signature = XXXX-XXXX-XXXX-XXXX (optional string 16)
		 *  license_signature = XXXXXXXXXX (mandatory, 1024)
		 *  application_data = xxxxxxxxx (optional string 16)
		 */
		const char * license_signature = ini.GetValue(productNamePtr,
				"license_signature", NULL);
		long license_version = ini.GetLongValue(productNamePtr,
				"license_version", -1);
		if (license_signature != NULL && license_version > 0) {
			string from_date = trim_copy(
					ini.GetValue(productNamePtr, "from_date",
							FullLicenseInfo::UNUSED_TIME));
			string to_date = trim_copy(
					ini.GetValue(productNamePtr, "to_date",
							FullLicenseInfo::UNUSED_TIME));
			string client_signature = trim_copy(
					ini.GetValue(productNamePtr, "client_signature", ""));
			/*client_signature.erase(
			 std::remove(client_signature.begin(), client_signature.end(), '-'),
			 client_signature.end());*/
			int from_sw_version = ini.GetLongValue(productNamePtr,
					"from_sw_version",
					FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			int to_sw_version = ini.GetLongValue(productNamePtr,
					"to_sw_version", FullLicenseInfo::UNUSED_SOFTWARE_VERSION);
			string extra_data = trim_copy(
					ini.GetValue(productNamePtr, "extra_data", ""));
			FullLicenseInfo licInfo(*it, product, license_signature,
					(int) license_version, from_date, to_date, client_signature,
					from_sw_version, to_sw_version, extra_data);
			licenseInfoOut.push_back(licInfo);
			atLeastOneLicenseComplete = true;
		} else {
			result.addEvent(LICENSE_MALFORMED, SVRT_WARN, *it);
		}
	}
	if (!loadAtLeastOneFile) {
		result.turnEventIntoError(FILE_FORMAT_NOT_RECOGNIZED);
	}
	if (!atLeastOneProductLicensed) {
		result.turnEventIntoError(PRODUCT_NOT_LICENSED);
	}
	if (!atLeastOneLicenseComplete) {
		result.turnEventIntoError(LICENSE_MALFORMED);
	}
	return result;
}